

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::CWallet::MarkDirty(CWallet *this)

{
  long lVar1;
  bool bVar2;
  AnnotatedMixin<std::recursive_mutex> *in_RDI;
  long in_FS_OFFSET;
  pair<const_uint256,_wallet::CWalletTx> *item;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *__range2;
  iterator __end2;
  iterator __begin2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock20;
  CWalletTx *in_stack_ffffffffffffff98;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffbb;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  AnnotatedMixin<std::recursive_mutex> *mutexIn;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mutexIn = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffd8,mutexIn,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc,(bool)in_stack_ffffffffffffffbb);
  std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::begin(in_stack_ffffffffffffffa0);
  std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::end(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       in_RDI,(_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                               *)in_stack_ffffffffffffffa0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
    operator*((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
              in_stack_ffffffffffffff98);
    CWalletTx::MarkDirty(in_stack_ffffffffffffff98);
    std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
    operator++((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
               in_stack_ffffffffffffff98);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::MarkDirty()
{
    {
        LOCK(cs_wallet);
        for (std::pair<const uint256, CWalletTx>& item : mapWallet)
            item.second.MarkDirty();
    }
}